

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

int __thiscall Fl_Data_Type::open(Fl_Data_Type *this,char *__file,int __oflag,...)

{
  Fl_Input_ *pFVar1;
  Fl_Input *pFVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Fl_Button *pFVar6;
  char *pcVar7;
  Fl_Menu_Item *pFVar8;
  Fl_Choice *pFVar9;
  byte bVar10;
  Fl_Choice **ppFVar11;
  uint uVar12;
  char *pcVar13;
  Fl_Input_ *pFVar14;
  Fl_Input_ *n;
  Fl_Choice **ppFVar15;
  Fl_Data_Type *pFVar16;
  
  if (data_panel == (Fl_Double_Window *)0x0) {
    make_data_panel();
  }
  Fl_Input_::static_value
            (&data_input->super_Fl_Input_,(this->super_Fl_Decl_Type).super_Fl_Type.name_);
  pFVar16 = this;
  do {
    pFVar16 = (Fl_Data_Type *)(pFVar16->super_Fl_Decl_Type).super_Fl_Type.parent;
    if (pFVar16 == (Fl_Data_Type *)0x0) {
      ppFVar11 = &data_choice;
      Fl_Choice::value(data_choice,
                       ((byte)(this->super_Fl_Decl_Type).public_ & 1) +
                       ((byte)(this->super_Fl_Decl_Type).static_ & 1) * 2);
      ppFVar15 = &data_class_choice;
      goto LAB_0017aa6d;
    }
    iVar5 = (*(pFVar16->super_Fl_Decl_Type).super_Fl_Type._vptr_Fl_Type[0x26])(pFVar16);
  } while (iVar5 == 0);
  ppFVar11 = &data_class_choice;
  Fl_Choice::value(data_class_choice,(int)(this->super_Fl_Decl_Type).public_);
  ppFVar15 = &data_choice;
LAB_0017aa6d:
  (*((*ppFVar11)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[5])();
  (*((*ppFVar15)->super_Fl_Menu_).super_Fl_Widget._vptr_Fl_Widget[6])();
  pcVar13 = this->filename_;
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "";
  }
  Fl_Input_::value(&data_filename->super_Fl_Input_,pcVar13);
  pcVar13 = (this->super_Fl_Decl_Type).super_Fl_Type.comment_;
  if (pcVar13 == (char *)0x0) {
    pcVar13 = "";
  }
  Fl_Text_Buffer::text((data_comment_input->super_Fl_Text_Display).mBuffer,pcVar13);
  pcVar13 = (char *)data_panel;
  (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
  bVar3 = true;
  do {
    if (!bVar3) {
      pcVar13 = "%s";
      fl_alert("%s");
    }
    while( true ) {
      pFVar6 = (Fl_Button *)Fl::readqueue();
      if (pFVar6 == data_panel_cancel) goto LAB_0017aea1;
      if (pFVar6 == &data_panel_ok->super_Fl_Button) break;
      if (pFVar6 == data_filebrowser) {
        goto_source_dir();
        pcVar13 = "Load Binary Data";
        pcVar7 = fl_file_chooser("Load Binary Data",(char *)0x0,
                                 (data_filename->super_Fl_Input_).value_,1);
        leave_source_dir();
        pFVar2 = data_filename;
        if (pcVar7 != (char *)0x0) {
          iVar5 = strcmp(pcVar7,(data_filename->super_Fl_Input_).value_);
          pcVar13 = (char *)pFVar2;
          if (iVar5 != 0) {
            set_modflag(1);
            pcVar13 = (char *)data_filename;
          }
          Fl_Input_::value((Fl_Input_ *)pcVar13,pcVar7);
        }
      }
      else if (pFVar6 == (Fl_Button *)0x0) {
        Fl::wait(pcVar13);
      }
    }
    pcVar13 = strdup((data_input->super_Fl_Input_).value_);
    n = (Fl_Input_ *)&((Fl_Input_ *)((long)pcVar13 + -200))->field_0xc7;
    pFVar14 = (Fl_Input_ *)pcVar13;
    do {
      pFVar14 = (Fl_Input_ *)
                ((long)&(((Fl_Window *)&pFVar14->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget.
                        _vptr_Fl_Widget + 1);
      bVar10 = *(byte *)((long)&(((Fl_Window *)&n->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget
                                ._vptr_Fl_Widget + 1);
      n = (Fl_Input_ *)
          ((long)&(((Fl_Window *)&n->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget.
                  _vptr_Fl_Widget + 1);
      iVar5 = isspace((uint)bVar10);
    } while (iVar5 != 0);
    iVar5 = isalpha((uint)bVar10);
    if (((iVar5 != 0) || (bVar10 == 0x5f)) || (bVar10 == 0x3a)) {
      while( true ) {
        bVar10 = *(byte *)&(((Fl_Window *)&pFVar14->super_Fl_Widget)->super_Fl_Group).
                           super_Fl_Widget._vptr_Fl_Widget;
        iVar5 = isalnum((uint)bVar10);
        if (((iVar5 == 0) && (bVar10 != 0x3a)) && (pFVar1 = pFVar14, bVar10 != 0x5f)) break;
        pFVar14 = (Fl_Input_ *)
                  ((long)&(((Fl_Window *)&pFVar14->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget
                          ._vptr_Fl_Widget + 1);
      }
      while (bVar10 != 0) {
        iVar5 = isspace((uint)bVar10);
        if (iVar5 == 0) goto LAB_0017ac32;
        bVar10 = *(byte *)((long)&(((Fl_Window *)&pFVar1->super_Fl_Widget)->super_Fl_Group).
                                  super_Fl_Widget._vptr_Fl_Widget + 1);
        pFVar1 = (Fl_Input_ *)
                 ((long)&(((Fl_Window *)&pFVar1->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget.
                         _vptr_Fl_Widget + 1);
      }
      if (n != pFVar1) break;
    }
LAB_0017ac32:
    free(pcVar13);
    bVar3 = false;
  } while( true );
  *(undefined1 *)
   &(((Fl_Window *)&pFVar14->super_Fl_Widget)->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget = 0;
  Fl_Type::name((Fl_Type *)this,(char *)n);
  free(pcVar13);
  pFVar16 = this;
  do {
    pFVar16 = (Fl_Data_Type *)(pFVar16->super_Fl_Decl_Type).super_Fl_Type.parent;
    if (pFVar16 == (Fl_Data_Type *)0x0) {
      pFVar8 = (data_choice->super_Fl_Menu_).value_;
      if (pFVar8 == (Fl_Menu_Item *)0x0) {
        uVar12 = 1;
      }
      else {
        uVar12 = (uint)((int)pFVar8 - *(int *)&(data_choice->super_Fl_Menu_).menu_) >> 3 & 1;
      }
      pFVar9 = data_choice;
      if (uVar12 != (int)(this->super_Fl_Decl_Type).public_) {
        set_modflag(1);
        pFVar9 = data_choice;
        pFVar8 = (data_choice->super_Fl_Menu_).value_;
        if (pFVar8 == (Fl_Menu_Item *)0x0) {
          bVar10 = 1;
        }
        else {
          bVar10 = (byte)((char)pFVar8 - (char)*(undefined4 *)&(data_choice->super_Fl_Menu_).menu_)
                   >> 3 & 1;
        }
        (this->super_Fl_Decl_Type).public_ = bVar10;
      }
      if (pFVar8 == (Fl_Menu_Item *)0x0) {
        uVar12 = 1;
      }
      else {
        uVar12 = -((uint)((int)pFVar8 - *(int *)&(pFVar9->super_Fl_Menu_).menu_) >> 3) >> 1 & 1;
      }
      if (uVar12 != (int)(this->super_Fl_Decl_Type).static_) {
        set_modflag(1);
        pFVar8 = (data_choice->super_Fl_Menu_).value_;
        if (pFVar8 == (Fl_Menu_Item *)0x0) {
          bVar10 = 1;
        }
        else {
          bVar10 = (byte)-((byte)((char)pFVar8 -
                                 (char)*(undefined4 *)&(data_choice->super_Fl_Menu_).menu_) >> 3) >>
                   1 & 1;
        }
        (this->super_Fl_Decl_Type).static_ = bVar10;
      }
      goto LAB_0017adc0;
    }
    iVar5 = (*(pFVar16->super_Fl_Decl_Type).super_Fl_Type._vptr_Fl_Type[0x26])(pFVar16);
  } while (iVar5 == 0);
  pFVar8 = (data_class_choice->super_Fl_Menu_).value_;
  if (pFVar8 == (Fl_Menu_Item *)0x0) {
    iVar5 = -1;
  }
  else {
    iVar5 = (int)((ulong)((long)pFVar8 - (long)(data_class_choice->super_Fl_Menu_).menu_) >> 3) *
            -0x49249249;
  }
  if (iVar5 != (this->super_Fl_Decl_Type).public_) {
    set_modflag(1);
    pFVar8 = (data_class_choice->super_Fl_Menu_).value_;
    if (pFVar8 == (Fl_Menu_Item *)0x0) {
      cVar4 = -1;
    }
    else {
      cVar4 = (char)((uint)((int)pFVar8 - *(int *)&(data_class_choice->super_Fl_Menu_).menu_) >> 3)
              * -0x49;
    }
    (this->super_Fl_Decl_Type).public_ = cVar4;
  }
LAB_0017adc0:
  pcVar13 = (data_filename->super_Fl_Input_).value_;
  pcVar7 = this->filename_;
  if (pcVar7 == (char *)0x0) {
    if (*pcVar13 != '\0') goto LAB_0017adeb;
  }
  else {
    iVar5 = strcmp(pcVar7,pcVar13);
    if (iVar5 == 0) {
LAB_0017ae02:
      free(pcVar7);
      this->filename_ = (char *)0x0;
    }
    else {
LAB_0017adeb:
      set_modflag(1);
      pcVar7 = this->filename_;
      if (pcVar7 != (char *)0x0) goto LAB_0017ae02;
    }
    if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
      pcVar13 = strdup(pcVar13);
      this->filename_ = pcVar13;
    }
  }
  pcVar13 = Fl_Text_Buffer::text((data_comment_input->super_Fl_Text_Display).mBuffer);
  if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
    if ((this->super_Fl_Decl_Type).super_Fl_Type.comment_ != (char *)0x0) {
      redraw_browser();
    }
    Fl_Type::comment((Fl_Type *)this,(char *)0x0);
    if (pcVar13 == (char *)0x0) goto LAB_0017aea1;
  }
  else {
    pcVar7 = (this->super_Fl_Decl_Type).super_Fl_Type.comment_;
    if ((pcVar7 == (char *)0x0) || (iVar5 = strcmp(pcVar13,pcVar7), iVar5 != 0)) {
      redraw_browser();
    }
    Fl_Type::comment((Fl_Type *)this,pcVar13);
  }
  free(pcVar13);
LAB_0017aea1:
  iVar5 = (*(data_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[6])();
  return iVar5;
}

Assistant:

void Fl_Data_Type::open() {
  if (!data_panel) make_data_panel();
  data_input->static_value(name());
  if (is_in_class()) {
    data_class_choice->value(public_);
    data_class_choice->show();
    data_choice->hide();
  } else {
    data_choice->value((public_&1)|((static_&1)<<1));
    data_choice->show();
    data_class_choice->hide();
  }
  data_filename->value(filename_?filename_:"");
  const char *c = comment();
  data_comment_input->buffer()->text(c?c:"");
  data_panel->show();
  const char* message = 0;
  for (;;) { // repeat as long as there are errors
    if (message) fl_alert("%s", message);
    for (;;) {
      Fl_Widget* w = Fl::readqueue();
      if (w == data_panel_cancel) goto BREAK2;
      else if (w == data_panel_ok) break;
      else if (w == data_filebrowser) {
        goto_source_dir();
        const char *fn = fl_file_chooser("Load Binary Data", 0L, data_filename->value(), 1);
        leave_source_dir();
        if (fn) {
          if (strcmp(fn, data_filename->value()))
            set_modflag(1); 
          data_filename->value(fn);
        }
      }
      else if (!w) Fl::wait();
    }
    // store the variable name:
    const char*c = data_input->value();
    char *s = strdup(c), *p = s, *q, *n;
    for (;;++p) {
      if (!isspace((unsigned char)(*p))) break;
    }
    n = p;
    if ( (!isalpha((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) goto OOPS;
    ++p;
    for (;;++p) {
      if ( (!isalnum((unsigned char)(*p))) && ((*p)!='_') && ((*p)!=':') ) break;
    }
    q = p;
    for (;;++q) {
      if (!*q) break;
      if (!isspace((unsigned char)(*q))) goto OOPS;
    }		
    if (n==q) {
    OOPS: message = "variable name must be a C identifier";
      free((void*)s);
      continue;
    }
    *p = 0;
    name(n);
    free(s);
    // store flags
    if (is_in_class()) {
      if (public_!=data_class_choice->value()) {
        set_modflag(1);
        public_ = data_class_choice->value();
      }
    } else {
      if (public_!=(data_choice->value()&1)) {
        set_modflag(1);
        public_ = (data_choice->value()&1);
      }
      if (static_!=((data_choice->value()>>1)&1)) {
        set_modflag(1);
        static_ = ((data_choice->value()>>1)&1);
      }
    }
    // store the filename
    c = data_filename->value();
    if (filename_ && strcmp(filename_, data_filename->value()))
      set_modflag(1); 
    else if (!filename_ && *c)
      set_modflag(1);
    if (filename_) { free((void*)filename_); filename_ = 0L; }
    if (c && *c) filename_ = strdup(c);
    // store the comment
    c = data_comment_input->buffer()->text();
    if (c && *c) {
      if (!comment() || strcmp(c, comment())) redraw_browser();
      comment(c);
    } else {
      if (comment()) redraw_browser();
      comment(0);
    }
    if (c) free((void*)c);
    break;
  }
BREAK2:
  data_panel->hide();
}